

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O1

void Abc_SclBufSize(Bus_Man_t *p,float Gain)

{
  Abc_Obj_t *pAVar1;
  void *pvVar2;
  Abc_Ntk_t *pAVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  SC_BusPars *pSVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *pVVar10;
  SC_Cell *pSVar11;
  SC_Timing *pSVar12;
  uint uVar13;
  char *__function;
  long lVar14;
  int iVar15;
  ulong uVar16;
  size_t __nmemb;
  char *__file;
  Bus_Man_t *p_00;
  SC_Cell *pSVar17;
  ulong uVar18;
  float fVar19;
  double dVar20;
  float fVar21;
  SC_Pair ArrOut1;
  SC_Pair ArrOut0;
  timespec ts;
  SC_Pair LoadIn;
  SC_Pair SlewIn;
  SC_Pair ArrIn;
  SC_Pair SlewOut;
  float local_94;
  SC_Pair local_88;
  SC_Pair local_80;
  timespec local_78;
  int local_64;
  long local_60;
  SC_Pair local_58;
  SC_Pair local_50;
  SC_Pair local_48;
  SC_Pair local_40;
  SC_Pair local_38;
  
  iVar8 = clock_gettime(3,&local_78);
  if (iVar8 < 0) {
    local_60 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    local_60 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  iVar8 = p->pNtk->vObjs->nSize;
  local_94 = Gain;
  if (p->pPars->fAddBufs != 0) {
    local_94 = Gain * Gain;
  }
  iVar15 = iVar8;
  if (0 < (long)iVar8) {
    local_64 = iVar8 * 2;
    uVar16 = (long)iVar8;
    iVar15 = local_64;
    do {
      pVVar10 = p->pNtk->vObjs;
      iVar9 = pVVar10->nSize;
      if ((long)iVar9 < (long)uVar16) goto LAB_00457ee4;
      uVar18 = uVar16 - 1;
      pAVar1 = (Abc_Obj_t *)pVVar10->pArray[uVar18];
      if (pAVar1 != (Abc_Obj_t *)0x0) {
        uVar13 = *(uint *)&pAVar1->field_0x14 & 0xf;
        if ((uVar13 == 2) || (uVar13 == 5)) {
          if (p->pPiDrive != (SC_Cell *)0x0) goto LAB_0045788b;
        }
        else if ((uVar13 == 7) && (0 < (pAVar1->vFanins).nSize)) {
LAB_0045788b:
          if (iVar15 < iVar9) {
            printf("Buffering could not be completed because the gain value (%d) is too low.\n");
            goto LAB_00457c87;
          }
          Abc_NtkComputeFanoutInfo(pAVar1,(float)p->pPars->Slew);
          fVar19 = Abc_NtkComputeNodeLoad(p,pAVar1);
          uVar13 = *(uint *)&pAVar1->field_0x14 & 0xf;
          if (((uVar13 != 2) && (uVar13 != 5)) &&
             ((pAVar3 = pAVar1->pNtk, uVar13 != 7 ||
              (((pAVar3->ntkFunc != ABC_FUNC_MAP || ((pAVar1->vFanins).nSize != 1)) ||
               ((pAVar1->field_5).pData != (void *)0x0)))))) {
            iVar9 = pAVar1->Id;
            if (((long)iVar9 < 0) || (pAVar3->vGates->nSize <= iVar9)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar9 = pAVar3->vGates->pArray[iVar9];
            if ((-1 < (long)iVar9) && (iVar9 < *(int *)((long)pAVar3->pSCLib + 100))) {
              pSVar17 = *(SC_Cell **)(*(long *)((long)pAVar3->pSCLib + 0x68) + (long)iVar9 * 8);
              pSVar11 = pSVar17->pAve;
              iVar9 = pSVar11->n_inputs;
              if ((long)iVar9 < 1) goto LAB_00457a11;
              uVar13 = (pSVar11->vPins).nSize;
              if ((int)uVar13 < 1) {
                uVar13 = 0;
              }
              if (iVar9 - 1U < uVar13) {
                fVar21 = 0.0;
                lVar14 = 0;
                do {
                  pvVar2 = (pSVar11->vPins).pArray[lVar14];
                  fVar21 = fVar21 + *(float *)((long)pvVar2 + 0x10) * 0.5 +
                                    *(float *)((long)pvVar2 + 0x14) * 0.5;
                  lVar14 = lVar14 + 1;
                } while (iVar9 != lVar14);
                goto LAB_00457a14;
              }
            }
LAB_00457ee4:
            __file = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
            ;
            __function = "void *Vec_PtrEntry(Vec_Ptr_t *, int)";
LAB_00457ef9:
            __assert_fail("i >= 0 && i < p->nSize",__file,0x184,__function);
          }
          pSVar17 = p->pPiDrive;
          fVar21 = fVar19;
          if (pSVar17 != (SC_Cell *)0x0) {
            iVar9 = pSVar17->n_inputs;
            if ((long)iVar9 < 1) {
LAB_00457a11:
              fVar21 = 0.0;
            }
            else {
              uVar13 = (pSVar17->vPins).nSize;
              if ((int)uVar13 < 1) {
                uVar13 = 0;
              }
              if (uVar13 <= iVar9 - 1U) goto LAB_00457ee4;
              fVar21 = 0.0;
              lVar14 = 0;
              do {
                pvVar2 = (pSVar17->vPins).pArray[lVar14];
                fVar21 = fVar21 + *(float *)((long)pvVar2 + 0x10) * 0.5 +
                                  *(float *)((long)pvVar2 + 0x14) * 0.5;
                lVar14 = lVar14 + 1;
              } while (iVar9 != lVar14);
            }
LAB_00457a14:
            if (iVar9 < 2) {
              iVar9 = 1;
            }
            fVar21 = fVar21 / (float)iVar9;
          }
          if ((p->pPars->fSizeOnly == 0) &&
             ((p->pPars->nDegree < (pAVar1->vFanouts).nSize || (fVar21 * local_94 < fVar19)))) {
            Abc_NodeCollectFanouts(pAVar1,p->vFanouts);
            __nmemb = (size_t)p->vFanouts->nSize;
            if (1 < (long)__nmemb) {
              qsort(p->vFanouts->pArray,__nmemb,8,Bus_SclCompareFanouts);
            }
            do {
              if (p->pPars->fVeryVerbose != 0) {
                Abc_NtkPrintFanoutProfileVec(pAVar1,p->vFanouts);
              }
              p_00 = p;
              pObj = Abc_SclAddOneInv(p,pAVar1,p->vFanouts,local_94);
              if (p->pPars->fVeryVerbose != 0) {
                Abc_SclOneNodePrint(p_00,pObj);
              }
              Bus_SclInsertFanout(p->vFanouts,pObj);
              fVar19 = Abc_NtkComputeFanoutLoad(p,p->vFanouts);
              iVar15 = p->vFanouts->nSize;
            } while ((p->pPars->nDegree < iVar15) || ((1 < iVar15 && (fVar21 * local_94 < fVar19))))
            ;
            pVVar10 = p->vFanouts;
            if (0 < pVVar10->nSize) {
              lVar14 = 0;
              do {
                if ((((Abc_Obj_t *)pVVar10->pArray[lVar14])->vFanins).nSize == 0) {
                  Abc_ObjAddFanin((Abc_Obj_t *)pVVar10->pArray[lVar14],pAVar1);
                }
                lVar14 = lVar14 + 1;
                pVVar10 = p->vFanouts;
              } while (lVar14 < pVVar10->nSize);
            }
            iVar15 = pAVar1->Id;
            if (((long)iVar15 < 0) ||
               (lVar14 = *(long *)((long)pAVar1->pNtk->pBSMan + 0x48),
               *(int *)(lVar14 + 4) <= iVar15)) {
              __file = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
              ;
              __function = "void Vec_FltWriteEntry(Vec_Flt_t *, int, float)";
              goto LAB_00457ef9;
            }
            *(undefined4 *)(*(long *)(lVar14 + 8) + (long)iVar15 * 4) = 0;
            fVar21 = Abc_NtkComputeNodeLoad(p,pAVar1);
            if ((1.0 <= fVar21 - fVar19) || (iVar15 = local_64, 1.0 <= fVar19 - fVar21)) {
              __assert_fail("LoadNew - Load < 1 && Load - LoadNew < 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c"
                            ,0x1c9,"void Abc_SclBufSize(Bus_Man_t *, float)");
            }
          }
          uVar13 = *(uint *)&pAVar1->field_0x14 & 0xf;
          if (((uVar13 != 2) && (uVar13 != 5)) &&
             ((Abc_NtkComputeNodeDeparture(pAVar1,(float)p->pPars->Slew),
              pAVar1->pNtk->ntkFunc != ABC_FUNC_MAP ||
              ((((*(uint *)&pAVar1->field_0x14 & 0xf) != 7 || ((pAVar1->vFanins).nSize != 1)) ||
               ((pAVar1->field_5).pData != (void *)0x0)))))) {
            pSVar11 = Abc_SclFindSmallestGate(pSVar17,fVar19 / local_94);
            iVar9 = pAVar1->Id;
            if (((long)iVar9 < 0) || (pVVar4 = pAVar1->pNtk->vGates, pVVar4->nSize <= iVar9)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            pVVar4->pArray[iVar9] = pSVar11->Id;
            if (p->pPars->fVeryVerbose != 0) {
              Abc_SclOneNodePrint((Bus_Man_t *)pSVar17,pAVar1);
            }
            if ((p->pPars->fSizeOnly == 0) && (p->pPars->nDegree < (pAVar1->vFanouts).nSize)) {
              __assert_fail("p->pPars->fSizeOnly || Abc_ObjFanoutNum(pObj) <= p->pPars->nDegree",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c"
                            ,0x1d5,"void Abc_SclBufSize(Bus_Man_t *, float)");
            }
          }
        }
      }
      bVar7 = 1 < (long)uVar16;
      uVar16 = uVar18;
    } while (bVar7);
    uVar16 = uVar18 & 0xffffffff;
LAB_00457c87:
    iVar15 = (int)uVar16;
  }
  dVar20 = 0.0;
  if ((iVar15 < 1) && (pVVar10 = p->pNtk->vCis, 0 < pVVar10->nSize)) {
    fVar19 = 0.0;
    lVar14 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)pVVar10->pArray[lVar14];
      fVar21 = Abc_NtkComputeNodeDeparture(pAVar1,(float)p->pPars->Slew);
      pSVar17 = p->pPiDrive;
      if (pSVar17 != (SC_Cell *)0x0) {
        iVar15 = pAVar1->Id;
        if (((long)iVar15 < 0) ||
           (lVar5 = *(long *)((long)pAVar1->pNtk->pBSMan + 0x48), *(int *)(lVar5 + 4) <= iVar15)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                        ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
        }
        local_58.rise = *(float *)(*(long *)(lVar5 + 8) + (long)iVar15 * 4);
        local_78.tv_sec = 0;
        local_40.rise = 0.0;
        local_40.fall = 0.0;
        local_48.rise = 0.0;
        local_48.fall = 0.0;
        local_80.rise = 0.0;
        local_80.fall = 0.0;
        local_88.rise = 0.0;
        local_88.fall = 0.0;
        local_50.rise = 0.0;
        local_50.fall = 0.0;
        local_38.rise = 0.0;
        local_38.fall = 0.0;
        local_58.fall = local_58.rise;
        if (pSVar17->n_inputs != 1) {
          __assert_fail("pCell->n_inputs == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLib.h"
                        ,0x2af,
                        "void Scl_LibHandleInputDriver(SC_Cell *, SC_Pair *, SC_Pair *, SC_Pair *)")
          ;
        }
        pSVar12 = Scl_CellPinTime(pSVar17,0);
        Scl_LibPinArrival(pSVar12,&local_40,&local_48,(SC_Pair *)&local_78,&local_80,&local_50);
        pSVar12 = Scl_CellPinTime(pSVar17,0);
        Scl_LibPinArrival(pSVar12,&local_40,&local_48,&local_58,&local_88,&local_38);
        fVar21 = fVar21 + (local_88.fall - local_80.fall) * 0.5 +
                          (local_88.rise - local_80.rise) * 0.5;
      }
      if (fVar19 <= fVar21) {
        fVar19 = fVar21;
      }
      lVar14 = lVar14 + 1;
      pVVar10 = p->pNtk->vCis;
    } while (lVar14 < pVVar10->nSize);
    dVar20 = (double)fVar19;
  }
  pSVar6 = p->pPars;
  if (pSVar6->fVerbose != 0) {
    printf("WireLoads = %d  Degree = %d  Target slew =%4d ps   Gain2 =%5d  Buf = %6d  Delay =%7.0f ps   "
           ,dVar20,(ulong)(uint)pSVar6->fUseWireLoads,(ulong)(uint)pSVar6->nDegree,
           (ulong)(uint)pSVar6->Slew,(ulong)(uint)pSVar6->GainRatio,
           (ulong)(uint)(p->pNtk->vObjs->nSize - iVar8));
    iVar15 = 3;
    iVar8 = clock_gettime(3,&local_78);
    if (iVar8 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    lVar14 = lVar14 + local_60;
    Abc_Print(iVar15,"%s =","Time");
    Abc_Print(iVar15,"%9.2f sec\n",(double)lVar14 / 1000000.0);
  }
  return;
}

Assistant:

void Abc_SclBufSize( Bus_Man_t * p, float Gain )
{
    SC_Cell * pCell, * pCellNew;
    Abc_Obj_t * pObj, * pFanout;
    abctime clk = Abc_Clock();
    int i, k, nObjsOld = Abc_NtkObjNumMax(p->pNtk);
    float GainGate, GainInv, Load, LoadNew, Cin, DeptMax = 0;
    GainGate = p->pPars->fAddBufs ? (float)pow( (double)Gain, (double)2.0 ) : Gain;
    GainInv  = p->pPars->fAddBufs ? (float)pow( (double)Gain, (double)2.0 ) : Gain;
    Abc_NtkForEachObjReverse( p->pNtk, pObj, i )
    {
        if ( !((Abc_ObjIsNode(pObj) && Abc_ObjFaninNum(pObj) > 0) || (Abc_ObjIsCi(pObj) && p->pPiDrive)) )
            continue;
        if ( 2 * nObjsOld < Abc_NtkObjNumMax(p->pNtk) )
        {
            printf( "Buffering could not be completed because the gain value (%d) is too low.\n", p->pPars->GainRatio );
            break;
        }
        // compute load
        Abc_NtkComputeFanoutInfo( pObj, p->pPars->Slew );
        Load = Abc_NtkComputeNodeLoad( p, pObj );
        // consider the gate
        if ( Abc_ObjIsCi(pObj) || Abc_ObjIsBarBuf(pObj) )
        {
            pCell = p->pPiDrive;
            // if PI driver is not given, assume Cin to be equal to Load
            // this way, buffering of the PIs is performed
            Cin = pCell ? SC_CellPinCapAve(pCell) : Load;
        }
        else
        {
            pCell = Abc_SclObjCell( pObj );
            Cin = SC_CellPinCapAve( pCell->pAve );
//        Cin = SC_CellPinCapAve( pCell->pRepr->pNext );
        }
        // consider buffering this gate
        if ( !p->pPars->fSizeOnly && (Abc_ObjFanoutNum(pObj) > p->pPars->nDegree || Load > GainGate * Cin) )
        {
            // add one or more inverters
//            Abc_NtkPrintFanoutProfile( pObj );
            Abc_NodeCollectFanouts( pObj, p->vFanouts );
            Vec_PtrSort( p->vFanouts, (int(*)(void))Bus_SclCompareFanouts );
            do 
            {
                Abc_Obj_t * pInv;
                if ( p->pPars->fVeryVerbose )//|| Vec_PtrSize(p->vFanouts) == Abc_ObjFanoutNum(pObj) )
                    Abc_NtkPrintFanoutProfileVec( pObj, p->vFanouts );
                pInv = Abc_SclAddOneInv( p, pObj, p->vFanouts, GainInv );
                if ( p->pPars->fVeryVerbose )
                    Abc_SclOneNodePrint( p, pInv );
                Bus_SclInsertFanout( p->vFanouts, pInv );
                Load = Abc_NtkComputeFanoutLoad( p, p->vFanouts );
            }
            while ( Vec_PtrSize(p->vFanouts) > p->pPars->nDegree || (Vec_PtrSize(p->vFanouts) > 1 && Load > GainGate * Cin) );
            // update node fanouts
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanouts, pFanout, k )
                if ( Abc_ObjFaninNum(pFanout) == 0 )
                    Abc_ObjAddFanin( pFanout, pObj );
            Bus_SclObjSetLoad( pObj, 0 );
            LoadNew = Abc_NtkComputeNodeLoad( p, pObj );
            assert( LoadNew - Load < 1 && Load - LoadNew < 1 );
        } 
        if ( Abc_ObjIsCi(pObj) )
            continue;
        Abc_NtkComputeNodeDeparture( pObj, p->pPars->Slew );
        if ( Abc_ObjIsBarBuf(pObj) )
            continue;
        // create cell
        pCellNew = Abc_SclFindSmallestGate( pCell, Load / GainGate );
        Abc_SclObjSetCell( pObj, pCellNew );
        if ( p->pPars->fVeryVerbose )
            Abc_SclOneNodePrint( p, pObj );
        assert( p->pPars->fSizeOnly || Abc_ObjFanoutNum(pObj) <= p->pPars->nDegree );
    }
    // compute departure time of the PI
    if ( i < 0 ) // finished buffering
    Abc_NtkForEachCi( p->pNtk, pObj, i )
    {
        float DeptCur = Abc_NtkComputeNodeDeparture(pObj, p->pPars->Slew);
        if ( p->pPiDrive )
        {
            float Load = Bus_SclObjLoad( pObj );
            SC_Pair ArrOut, SlewOut, LoadIn = { Load, Load }; 
            Scl_LibHandleInputDriver( p->pPiDrive, &LoadIn, &ArrOut, &SlewOut );
            DeptCur += 0.5 * ArrOut.fall +  0.5 * ArrOut.rise;
        }       
        DeptMax = Abc_MaxFloat( DeptMax, DeptCur );
    }
    if ( p->pPars->fVerbose )
    {
        printf( "WireLoads = %d  Degree = %d  Target slew =%4d ps   Gain2 =%5d  Buf = %6d  Delay =%7.0f ps   ", 
            p->pPars->fUseWireLoads, p->pPars->nDegree, p->pPars->Slew, p->pPars->GainRatio, 
            Abc_NtkObjNumMax(p->pNtk) - nObjsOld, DeptMax );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
}